

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

float * vera::skyEquirectangular(SkyData *_sky,size_t _width,size_t _height)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  float thetav;
  int iVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  double _x;
  double _y;
  double _z;
  col_type cVar9;
  float local_14c;
  float local_130;
  float local_124;
  ArHosekSkyModelState **local_118;
  int local_108;
  int i;
  int x_1;
  int y_1;
  float hdrScale;
  int index;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_f0;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_d8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_d4;
  vec3 sample;
  float gamma;
  float phi;
  float u;
  int x;
  float theta;
  float v;
  int y;
  float maxSample;
  mat3 XYZ_sRGB;
  ArHosekSkyModelState *skyState [9];
  bool normalize;
  float sunPhi;
  float sunTheta;
  float solarElevation;
  float *data;
  int nPixels;
  size_t _height_local;
  size_t _width_local;
  SkyData *_sky_local;
  
  iVar4 = (int)_width;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(iVar4 * (int)_height * 3);
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pfVar7 = (float *)operator_new__(uVar6);
  fVar1 = _sky->elevation;
  skyState[8]._4_4_ = 0.0;
  skyState[8]._3_1_ = 1;
  XYZ_sRGB.value[2]._4_8_ =
       arhosek_xyz_skymodelstate_alloc_init
                 ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_0.x,(double)fVar1);
  skyState[0] = arhosek_xyz_skymodelstate_alloc_init
                          ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_1.y,
                           (double)fVar1);
  skyState[1] = arhosek_xyz_skymodelstate_alloc_init
                          ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_2.z,
                           (double)fVar1);
  local_118 = skyState + 2;
  do {
    *local_118 = (ArHosekSkyModelState *)0x0;
    local_118 = local_118 + 1;
  } while (local_118 != skyState + 8);
  glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
            ((mat<3,_3,_float,_(glm::qualifier)0> *)&y,3.2404542,-0.969266,0.0556434,-1.5371385,
             1.8760108,-0.2040259,-0.4985314,0.041556,1.0572252);
  v = 1e-05;
  for (theta = 0.0; (ulong)(long)(int)theta < _height; theta = (float)((int)theta + 1)) {
    local_124 = (float)_height;
    thetav = (((float)(int)theta + 0.5) / local_124) * 3.1415927;
    if (thetav <= 1.5707964) {
      for (phi = 0.0; (ulong)(long)(int)phi < _width; phi = (float)((int)phi + 1)) {
        local_130 = (float)_width;
        sample.field_2.z =
             (((float)(int)phi + 0.5) / local_130) * -6.2831855 + 3.1415927 + _sky->azimuth;
        sample.field_1.y = angleBetween(thetav,sample.field_2.z,1.5707964 - fVar1,skyState[8]._4_4_)
        ;
        _x = arhosek_tristim_skymodel_radiance
                       ((ArHosekSkyModelState *)XYZ_sRGB.value[2]._4_8_,(double)thetav,
                        (double)sample.field_1.y,0);
        _y = arhosek_tristim_skymodel_radiance
                       (skyState[0],(double)thetav,(double)sample.field_1.y,1);
        _z = arhosek_tristim_skymodel_radiance
                       (skyState[1],(double)thetav,(double)sample.field_1.y,2);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&local_d8,_x,_y,_z);
        if ((skyState[8]._3_1_ & 1) != 0) {
          glm::vec<3,float,(glm::qualifier)0>::operator*=
                    ((vec<3,float,(glm::qualifier)0> *)&local_d8,0.018398786);
        }
        pfVar8 = std::max<float>(&v,(float *)&aStack_d4);
        v = *pfVar8;
        cVar9 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)&y,(row_type *)&local_d8);
        _hdrScale = cVar9._0_8_;
        local_f0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)cVar9.field_2;
        uVar2._0_4_ = hdrScale;
        uVar2._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)index;
        sample.field_0 = local_f0;
        iVar5 = (int)theta * iVar4 * 3 + (int)phi * 3;
        local_d8 = cVar9.field_0;
        *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)(pfVar7 + iVar5) =
             local_d8;
        aStack_d4 = cVar9.field_1;
        *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)(pfVar7 + (iVar5 + 1)) =
             aStack_d4;
        *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)(pfVar7 + (iVar5 + 2)) =
             local_f0;
        _local_d8 = uVar2;
      }
    }
  }
  arhosekskymodelstate_free((ArHosekSkyModelState *)XYZ_sRGB.value[2]._4_8_);
  arhosekskymodelstate_free(skyState[0]);
  arhosekskymodelstate_free(skyState[1]);
  if ((skyState[8]._3_1_ & 1) == 0) {
    local_14c = v / 16.0;
  }
  else {
    local_14c = v;
  }
  local_14c = 1.0 / local_14c;
  for (i = 0; (ulong)(long)i < _height; i = i + 1) {
    for (local_108 = 0; (ulong)(long)local_108 < _width; local_108 = local_108 + 1) {
      iVar5 = (i * iVar4 + local_108) * 3;
      if ((ulong)(long)i < _height >> 1) {
        pfVar7[iVar5] = local_14c * pfVar7[iVar5];
        pfVar7[iVar5 + 1] = local_14c * pfVar7[iVar5 + 1];
        pfVar7[iVar5 + 2] = local_14c * pfVar7[iVar5 + 2];
      }
      else {
        *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)(pfVar7 + iVar5) =
             (_sky->groundAlbedo).field_0;
        *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)(pfVar7 + (iVar5 + 1)) =
             (_sky->groundAlbedo).field_1;
        *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(pfVar7 + (iVar5 + 2)) =
             (_sky->groundAlbedo).field_2;
      }
    }
  }
  return pfVar7;
}

Assistant:

float* skyEquirectangular(SkyData* _sky, size_t _width, size_t _height) {
    int nPixels = _width * _height * 3;
    float *data = new float[nPixels]; 

    // FILAMENT SKYGEN 
    // https://github.com/google/filament/blob/master/tools/skygen/src/main.cpp
    //
    float solarElevation = _sky->elevation;
    float sunTheta = float(HALF_PI - solarElevation);
    float sunPhi = 0.0f;
    bool normalize = true;

    ArHosekSkyModelState* skyState[9] = {
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.r, solarElevation),
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.g, solarElevation),
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.b, solarElevation)
    };

    glm::mat3 XYZ_sRGB = glm::mat3(
            3.2404542f, -0.9692660f,  0.0556434f,
            -1.5371385f,  1.8760108f, -0.2040259f,
            -0.4985314f,  0.0415560f,  1.0572252f
    );

    float maxSample = 0.00001f;
    for (int y = 0; y < _height; y++) {
        float v = (y + 0.5f) / _height;
        float theta = float(M_PI * v);

        if (theta > HALF_PI) 
            continue;
            
        for (int x = 0; x < _width; x++) {
            float u = (x + 0.5f) / _width;
            float phi = float(-2.0 * M_PI * u + M_PI + _sky->azimuth);
            float gamma = angleBetween(theta, phi, sunTheta, sunPhi);

            glm::vec3 sample = glm::vec3(
                arhosek_tristim_skymodel_radiance(skyState[0], theta, gamma, 0),
                arhosek_tristim_skymodel_radiance(skyState[1], theta, gamma, 1),
                arhosek_tristim_skymodel_radiance(skyState[2], theta, gamma, 2)
            );

            if (normalize)
                sample *= float(4.0 * M_PI / 683.0);

            maxSample = std::max(maxSample, sample.y);
            sample = XYZ_sRGB * sample;

            int index = (y * _width * 3) + x * 3;
            data[index] = sample.r;
            data[index + 1] = sample.g;
            data[index + 2] = sample.b;
        }
    }

    // cleanup sky data
    arhosekskymodelstate_free(skyState[0]);
    arhosekskymodelstate_free(skyState[1]);
    arhosekskymodelstate_free(skyState[2]);

    float hdrScale = 1.0f / (normalize ? maxSample : maxSample / 16.0f);

    for (int y = 0; y < _height; y++) {
        for (int x = 0; x < _width; x++) {
            int i = (y * _width) + x;
            i *= 3;

            if (y >= _height / 2) {
                data[i + 0] = _sky->groundAlbedo.r;
                data[i + 1] = _sky->groundAlbedo.g;
                data[i + 2] = _sky->groundAlbedo.b;
            }
            else {
                data[i + 0] *= hdrScale;
                data[i + 1] *= hdrScale;
                data[i + 2] *= hdrScale;
            }
        }
    }

    return data;
}